

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O2

int checkerBig2(void)

{
  uint uVar1;
  FILE *__stream;
  char *__s;
  char *pcVar2;
  int iVar3;
  int d;
  int d3;
  int d2;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar1 = 0xffffffff;
  }
  else {
    for (iVar3 = 1; iVar3 != 0x1389; iVar3 = iVar3 + 1) {
      __s = ScanInt((FILE *)__stream,&d);
      if (__s != "PASSED") goto LAB_00103cb4;
      if (((d != 2) && (1 < iVar3 - 1U)) && (iVar3 != 0x7c1)) {
LAB_00103c0b:
        printf("wrong output -- ");
        __s = "FAILED";
        goto LAB_00103c95;
      }
      if (((iVar3 == 1 && d != 0) || (iVar3 == 2 && d != 2)) || (iVar3 == 0x7c1 && d != 1))
      goto LAB_00103c0b;
    }
    pcVar2 = ScanIntInt((FILE *)__stream,&d,&d2);
    __s = "FAILED";
    if ((pcVar2 == "PASSED") && (pcVar2 = ScanInt((FILE *)__stream,&d3), pcVar2 == "PASSED")) {
      if ((d == 2) && ((d2 == 0x7c1 && (d3 == 1)))) {
        __s = "PASSED";
      }
      else {
        printf("wrong output -- ");
      }
    }
LAB_00103c95:
    if ((__s == "PASSED") &&
       (iVar3 = HaveGarbageAtTheEnd((FILE *)__stream), __s = "PASSED", iVar3 != 0)) {
      __s = "FAILED";
    }
LAB_00103cb4:
    fclose(__stream);
    puts(__s);
    uVar1 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar1;
}

Assistant:

static int checkerBig2(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 1; i <= 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if (i != 1 && i != 2 && i != 1985 && d != 2) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 1 && d != 0) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 2 && d != 2) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
        if (i == 1985 && d != 1) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        int d1, d2, d3;
        if (ScanIntInt(out, &d1, &d2) != Pass || ScanInt(out, &d3) != Pass) {
            message = Fail;
        } else if (d1 != 2 || d2 != 1985 || d3 != 1) {
            printf("wrong output -- ");
            message = Fail;
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}